

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::AttributeArray::bindAttribute(AttributeArray *this,deUint32 loc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  InputType IVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Context *pCVar8;
  bool bVar9;
  GLenum GVar10;
  deUint32 dVar11;
  float *pfVar12;
  uint *puVar13;
  uint local_104;
  char *pcStack_50;
  int size;
  deUint8 *basePtr;
  UVec4 attr_2;
  IVec4 attr_1;
  Vec4 attr;
  deUint32 loc_local;
  AttributeArray *this_local;
  
  bVar9 = isBound(this);
  if (bVar9) {
    pcStack_50 = (char *)0x0;
    if (this->m_storage == STORAGE_BUFFER) {
      pCVar8 = this->m_ctx;
      GVar10 = targetToGL(this->m_target);
      (*pCVar8->_vptr_Context[0x25])(pCVar8,(ulong)GVar10,(ulong)this->m_glBuffer);
      dVar11 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar11,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x431);
      pcStack_50 = (char *)0x0;
    }
    else if (this->m_storage == STORAGE_USER) {
      pCVar8 = this->m_ctx;
      GVar10 = targetToGL(this->m_target);
      (*pCVar8->_vptr_Context[0x25])(pCVar8,(ulong)GVar10,0);
      dVar11 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar11,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x438);
      pcStack_50 = this->m_data;
    }
    bVar9 = inputTypeIsFloatType(this->m_inputType);
    if (bVar9) {
      pCVar8 = this->m_ctx;
      uVar5 = this->m_componentCount;
      GVar10 = inputTypeToGL(this->m_inputType);
      (*pCVar8->_vptr_Context[0x4e])
                (pCVar8,(ulong)loc,(ulong)uVar5,(ulong)GVar10,(ulong)(this->m_normalize & 1),
                 (ulong)(uint)this->m_stride,pcStack_50 + this->m_offset);
      dVar11 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar11,"glVertexAttribPointer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x45c);
    }
    else {
      bVar9 = outputTypeIsFloatType(this->m_outputType);
      if (bVar9) {
        if ((this->m_bgraOrder & 1U) == 0) {
          local_104 = this->m_componentCount;
        }
        else {
          local_104 = 0x80e1;
        }
        pCVar8 = this->m_ctx;
        GVar10 = inputTypeToGL(this->m_inputType);
        (*pCVar8->_vptr_Context[0x4e])
                  (pCVar8,(ulong)loc,(ulong)local_104,(ulong)GVar10,(ulong)(this->m_normalize & 1),
                   (ulong)(uint)this->m_stride,pcStack_50 + this->m_offset);
        dVar11 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar11,"glVertexAttribPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,1099);
      }
      else {
        pCVar8 = this->m_ctx;
        uVar5 = this->m_componentCount;
        GVar10 = inputTypeToGL(this->m_inputType);
        (*pCVar8->_vptr_Context[0x4f])
                  (pCVar8,(ulong)loc,(ulong)uVar5,(ulong)GVar10,(ulong)(uint)this->m_stride,
                   pcStack_50 + this->m_offset);
        dVar11 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar11,"glVertexAttribIPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,0x451);
      }
    }
    if (this->m_instanceDivisor != 0) {
      (*this->m_ctx->_vptr_Context[0x52])
                (this->m_ctx,(ulong)loc,(ulong)(uint)this->m_instanceDivisor);
    }
  }
  else {
    IVar4 = this->m_inputType;
    if (IVar4 == INPUTTYPE_FLOAT) {
      rr::GenericVec4::get<float>((GenericVec4 *)(attr_1.m_data + 2));
      switch(this->m_componentCount) {
      case 1:
        pCVar8 = this->m_ctx;
        pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(attr_1.m_data + 2));
        (*pCVar8->_vptr_Context[0x53])((ulong)(uint)*pfVar12,pCVar8,(ulong)loc);
        break;
      case 2:
        pCVar8 = this->m_ctx;
        pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar1 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(attr_1.m_data + 2));
        (*pCVar8->_vptr_Context[0x54])((ulong)(uint)fVar1,(ulong)(uint)*pfVar12,pCVar8,(ulong)loc);
        break;
      case 3:
        pCVar8 = this->m_ctx;
        pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar1 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar2 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(attr_1.m_data + 2));
        (*pCVar8->_vptr_Context[0x55])
                  ((ulong)(uint)fVar1,(ulong)(uint)fVar2,*pfVar12,pCVar8,(ulong)loc);
        break;
      case 4:
        pCVar8 = this->m_ctx;
        pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar1 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar2 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(attr_1.m_data + 2));
        fVar3 = *pfVar12;
        pfVar12 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(attr_1.m_data + 2));
        (*pCVar8->_vptr_Context[0x56])
                  ((ulong)(uint)fVar1,(ulong)(uint)fVar2,fVar3,*pfVar12,pCVar8,(ulong)loc);
      }
    }
    else if (IVar4 == INPUTTYPE_INT) {
      rr::GenericVec4::get<int>((GenericVec4 *)(attr_2.m_data + 2));
      pCVar8 = this->m_ctx;
      puVar13 = (uint *)tcu::Vector<int,_4>::x((Vector<int,_4> *)(attr_2.m_data + 2));
      uVar5 = *puVar13;
      puVar13 = (uint *)tcu::Vector<int,_4>::y((Vector<int,_4> *)(attr_2.m_data + 2));
      uVar6 = *puVar13;
      puVar13 = (uint *)tcu::Vector<int,_4>::z((Vector<int,_4> *)(attr_2.m_data + 2));
      uVar7 = *puVar13;
      puVar13 = (uint *)tcu::Vector<int,_4>::w((Vector<int,_4> *)(attr_2.m_data + 2));
      (*pCVar8->_vptr_Context[0x57])
                (pCVar8,(ulong)loc,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)*puVar13);
    }
    else if (IVar4 == INPUTTYPE_UNSIGNED_INT) {
      rr::GenericVec4::get<unsigned_int>((GenericVec4 *)((long)&basePtr + 4));
      pCVar8 = this->m_ctx;
      puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)((long)&basePtr + 4));
      uVar5 = *puVar13;
      puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)((long)&basePtr + 4));
      uVar6 = *puVar13;
      puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)((long)&basePtr + 4));
      uVar7 = *puVar13;
      puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)((long)&basePtr + 4));
      (*pCVar8->_vptr_Context[0x58])
                (pCVar8,(ulong)loc,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)*puVar13);
    }
  }
  return;
}

Assistant:

void AttributeArray::bindAttribute (deUint32 loc)
{
	if (!isBound())
	{
		switch (m_inputType)
		{
			case DrawTestSpec::INPUTTYPE_FLOAT:
			{
				tcu::Vec4 attr = m_defaultAttrib.get<float>();

				switch (m_componentCount)
				{
					case 1: m_ctx.vertexAttrib1f(loc, attr.x()); break;
					case 2: m_ctx.vertexAttrib2f(loc, attr.x(), attr.y()); break;
					case 3: m_ctx.vertexAttrib3f(loc, attr.x(), attr.y(), attr.z()); break;
					case 4: m_ctx.vertexAttrib4f(loc, attr.x(), attr.y(), attr.z(), attr.w()); break;
					default: DE_ASSERT(DE_FALSE); break;
				}
				break;
			}
			case DrawTestSpec::INPUTTYPE_INT:
			{
				tcu::IVec4 attr = m_defaultAttrib.get<deInt32>();
				m_ctx.vertexAttribI4i(loc, attr.x(), attr.y(), attr.z(), attr.w());
				break;
			}
			case DrawTestSpec::INPUTTYPE_UNSIGNED_INT:
			{
				tcu::UVec4 attr = m_defaultAttrib.get<deUint32>();
				m_ctx.vertexAttribI4ui(loc, attr.x(), attr.y(), attr.z(), attr.w());
				break;
			}
			default:
				DE_ASSERT(DE_FALSE);
				break;
		}
	}
	else
	{
		const deUint8* basePtr = DE_NULL;

		if (m_storage == DrawTestSpec::STORAGE_BUFFER)
		{
			m_ctx.bindBuffer(targetToGL(m_target), m_glBuffer);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

			basePtr = DE_NULL;
		}
		else if (m_storage == DrawTestSpec::STORAGE_USER)
		{
			m_ctx.bindBuffer(targetToGL(m_target), 0);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

			basePtr = (const deUint8*)m_data;
		}
		else
			DE_ASSERT(DE_FALSE);

		if (!inputTypeIsFloatType(m_inputType))
		{
			// Input is not float type

			if (outputTypeIsFloatType(m_outputType))
			{
				const int size = (m_bgraOrder) ? (GL_BGRA) : (m_componentCount);

				DE_ASSERT(!(m_bgraOrder && m_componentCount != 4));

				// Output type is float type
				m_ctx.vertexAttribPointer(loc, size, inputTypeToGL(m_inputType), m_normalize, m_stride, basePtr + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
			}
			else
			{
				// Output type is int type
				m_ctx.vertexAttribIPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_stride, basePtr + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribIPointer()");
			}
		}
		else
		{
			// Input type is float type

			// Output type must be float type
			DE_ASSERT(outputTypeIsFloatType(m_outputType));

			m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, basePtr + m_offset);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
		}

		if (m_instanceDivisor)
			m_ctx.vertexAttribDivisor(loc, m_instanceDivisor);
	}
}